

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O3

int yang_fill_unique(lys_module *module,lys_node_list *list,lys_unique *unique,char *value,
                    unres_schema *unres)

{
  ushort *puVar1;
  int iVar2;
  char *pcVar3;
  ushort **ppuVar4;
  char **ppcVar5;
  char *pcVar6;
  undefined8 *item;
  LY_ERR *pLVar7;
  ulong uVar8;
  ulong uVar9;
  uint8_t uVar10;
  byte bVar11;
  
  pcVar3 = strpbrk(value," \t\n");
  if (pcVar3 == (char *)0x0) {
    uVar10 = unique->expr_size;
  }
  else {
    ppuVar4 = __ctype_b_loc();
    puVar1 = *ppuVar4;
    uVar10 = unique->expr_size;
    do {
      uVar10 = uVar10 + '\x01';
      unique->expr_size = uVar10;
      pcVar3 = pcVar3 + -1;
      do {
        pcVar6 = pcVar3 + 1;
        pcVar3 = pcVar3 + 1;
      } while ((*(byte *)((long)puVar1 + (long)*pcVar6 * 2 + 1) & 0x20) != 0);
      pcVar3 = strpbrk(pcVar3," \t\n");
    } while (pcVar3 != (char *)0x0);
  }
  bVar11 = uVar10 + 1;
  unique->expr_size = bVar11;
  ppcVar5 = (char **)calloc((ulong)bVar11,8);
  unique->expr = ppcVar5;
  if (ppcVar5 == (char **)0x0) {
    pLVar7 = ly_errno_location();
    *pLVar7 = LY_EMEM;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","yang_fill_unique");
LAB_0014b4d0:
    iVar2 = 1;
  }
  else {
    if (bVar11 != 0) {
      uVar9 = 0;
      do {
        pcVar3 = strpbrk(value," \t\n");
        if (pcVar3 == (char *)0x0) {
          pcVar3 = value;
        }
        pcVar6 = lydict_insert(module->ctx,value,(long)pcVar3 - (long)value);
        unique->expr[uVar9] = pcVar6;
        if (uVar9 != 0) {
          pcVar6 = unique->expr[uVar9];
          uVar8 = 0;
          do {
            if (unique->expr[uVar8] == pcVar6) {
              ly_vlog(LYE_INARG,LY_VLOG_LYS,list,pcVar6,"unique");
              ly_vlog(LYE_SPEC,LY_VLOG_LYS,list,"The identifier is not unique");
              goto LAB_0014b4d0;
            }
            uVar8 = uVar8 + 1;
          } while (uVar9 != uVar8);
        }
        if (unres == (unres_schema *)0x0) {
          iVar2 = resolve_unique((lys_node *)list,unique->expr[uVar9],&unique->trg_type);
          if (iVar2 != 0) goto LAB_0014b4d0;
        }
        else {
          item = (undefined8 *)malloc(0x18);
          *item = list;
          item[1] = unique->expr[uVar9];
          item[2] = &unique->trg_type;
          iVar2 = unres_schema_add_node(module,unres,item,UNRES_LIST_UNIQ,(lys_node *)0x0);
          if (iVar2 == -1) goto LAB_0014b4d0;
        }
        ppuVar4 = __ctype_b_loc();
        value = pcVar3 + -1;
        do {
          pcVar3 = value + 1;
          value = value + 1;
        } while ((*(byte *)((long)*ppuVar4 + (long)*pcVar3 * 2 + 1) & 0x20) != 0);
        uVar9 = uVar9 + 1;
      } while (uVar9 < unique->expr_size);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
yang_fill_unique(struct lys_module *module, struct lys_node_list *list, struct lys_unique *unique, char *value, struct unres_schema *unres)
{
    int i, j;
    char *vaux;
    struct unres_list_uniq *unique_info;

    /* count the number of unique leafs in the value */
    vaux = value;
    while ((vaux = strpbrk(vaux, " \t\n"))) {
       unique->expr_size++;
        while (isspace(*vaux)) {
            vaux++;
        }
    }
    unique->expr_size++;
    unique->expr = calloc(unique->expr_size, sizeof *unique->expr);
    if (!unique->expr) {
        LOGMEM;
        goto error;
    }

    for (i = 0; i < unique->expr_size; i++) {
        vaux = strpbrk(value, " \t\n");
        if (!vaux) {
            /* the last token, lydict_insert() will count its size on its own */
            vaux = value;
        }

        /* store token into unique structure */
        unique->expr[i] = lydict_insert(module->ctx, value, vaux - value);

        /* check that the expression does not repeat */
        for (j = 0; j < i; j++) {
            if (ly_strequal(unique->expr[j], unique->expr[i], 1)) {
                LOGVAL(LYE_INARG, LY_VLOG_LYS, list, unique->expr[i], "unique");
                LOGVAL(LYE_SPEC, LY_VLOG_LYS, list, "The identifier is not unique");
                goto error;
            }
        }
        /* try to resolve leaf */
        if (unres) {
            unique_info = malloc(sizeof *unique_info);
            unique_info->list = (struct lys_node *)list;
            unique_info->expr = unique->expr[i];
            unique_info->trg_type = &unique->trg_type;
            if (unres_schema_add_node(module, unres, unique_info, UNRES_LIST_UNIQ, NULL) == -1) {
                goto error;
            }
        } else {
            if (resolve_unique((struct lys_node *)list, unique->expr[i], &unique->trg_type)) {
                goto error;
            }
        }

        /* move to next token */
        value = vaux;
        while(isspace(*value)) {
            value++;
        }
    }

    return EXIT_SUCCESS;

error:
    return EXIT_FAILURE;
}